

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> * __thiscall
chaiscript::dispatch::Param_Types::convert
          (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
           *__return_storage_ptr__,Param_Types *this,Function_Params t_params,
          Type_Conversions_State *t_conversions)

{
  long *plVar1;
  pointer ppVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  Type_Info *ti;
  ulong uVar6;
  long lVar7;
  pointer pBVar8;
  long lVar9;
  Type_Info dynamic_object_type_info;
  undefined1 local_68 [32];
  Type_Info local_48;
  
  local_68._24_8_ = t_conversions;
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  vector<chaiscript::Boxed_Value_const*,void>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)
             __return_storage_ptr__,t_params.m_begin,t_params.m_end,(allocator_type *)local_68);
  local_48.m_type_info = (type_info *)&Dynamic_Object::typeinfo;
  local_48.m_bare_type_info = (type_info *)&Dynamic_Object::typeinfo;
  local_48.m_flags = 0;
  pBVar8 = (__return_storage_ptr__->
           super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->
      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>)._M_impl
      .super__Vector_impl_data._M_finish != pBVar8) {
    lVar9 = 0x20;
    lVar7 = 0;
    uVar6 = 0;
    do {
      if (((*(long *)((long)(this->m_types).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x18) != 0) &&
          (bVar5 = Type_Info::bare_equal
                             (*(Type_Info **)
                               ((long)&(pBVar8->m_data).
                                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + lVar7),&local_48), !bVar5)) &&
         (ppVar2 = (this->m_types).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         (*(byte *)((long)&(ppVar2->first).field_2 + lVar9) & 0x20) == 0)) {
        ti = (Type_Info *)((long)&(ppVar2->first)._M_dataplus + lVar9);
        bVar5 = Type_Info::bare_equal
                          (*(Type_Info **)
                            ((long)&(pBVar8->m_data).
                                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar7),ti);
        if ((!bVar5) &&
           (bVar5 = Type_Conversions::converts
                              (*(Type_Conversions **)local_68._24_8_,ti,
                               *(Type_Info **)
                                ((long)&(pBVar8->m_data).
                                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + lVar7)), bVar5)) {
          Type_Conversions::boxed_type_conversion
                    ((Type_Conversions *)local_68,*(Type_Info **)local_68._24_8_,
                     (Conversion_Saves *)
                     ((long)&(((this->m_types).
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus +
                     lVar9),(Boxed_Value *)
                            ((reference_wrapper<chaiscript::Type_Conversions::Conversion_Saves> *)
                            (local_68._24_8_ + 8))->_M_data);
          uVar4 = local_68._8_8_;
          uVar3 = local_68._0_8_;
          pBVar8 = (__return_storage_ptr__->
                   super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_68._0_8_ = 0;
          local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(pBVar8->m_data).
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount + lVar7);
          plVar1 = (long *)((long)&(pBVar8->m_data).
                                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar7);
          *plVar1 = uVar3;
          plVar1[1] = uVar4;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
          }
        }
      }
      uVar6 = uVar6 + 1;
      pBVar8 = (__return_storage_ptr__->
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x38;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)(__return_storage_ptr__->
                                   super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar8 >> 4))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Boxed_Value> convert(Function_Params t_params, const Type_Conversions_State &t_conversions) const {
        auto vals = t_params.to_vector();
        const auto dynamic_object_type_info = user_type<Dynamic_Object>();
        for (size_t i = 0; i < vals.size(); ++i) {
          const auto &name = m_types[i].first;
          if (!name.empty()) {
            const auto &bv = vals[i];

            if (!bv.get_type_info().bare_equal(dynamic_object_type_info)) {
              const auto &ti = m_types[i].second;
              if (!ti.is_undef()) {
                if (!bv.get_type_info().bare_equal(ti)) {
                  if (t_conversions->converts(ti, bv.get_type_info())) {
                    try {
                      // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
                      // either way, we are not responsible if it doesn't work
                      vals[i] = t_conversions->boxed_type_conversion(m_types[i].second, t_conversions.saves(), vals[i]);
                    } catch (...) {
                      try {
                        // try going the other way
                        vals[i] = t_conversions->boxed_type_down_conversion(m_types[i].second, t_conversions.saves(), vals[i]);
                      } catch (const chaiscript::detail::exception::bad_any_cast &) {
                        throw exception::bad_boxed_cast(bv.get_type_info(), *m_types[i].second.bare_type_info());
                      }
                    }
                  }
                }
              }
            }
          }
        }

        return vals;
      }